

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void __thiscall QWhatsThisAction::QWhatsThisAction(QWhatsThisAction *this,QObject *parent)

{
  QKeyCombination QVar1;
  QKeyCombination QVar2;
  QKeyCombination QVar3;
  QKeyCombination QVar4;
  QObject *in_RSI;
  QAction *in_RDI;
  long in_FS_OFFSET;
  QPixmap p;
  int combined;
  int in_stack_ffffffffffffff2c;
  Key in_stack_ffffffffffffff30;
  KeyboardModifier in_stack_ffffffffffffff34;
  QString *s;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  offset_in_QAction_to_subr in_stack_ffffffffffffffa0;
  Connection local_48;
  ConnectionType in_stack_ffffffffffffffc0;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  s = (QString *)local_20;
  tr((char *)s,(char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
     in_stack_ffffffffffffff2c);
  QAction::QAction(in_RDI,s,in_RSI);
  QString::~QString((QString *)0x4c4534);
  *(undefined ***)in_RDI = &PTR_metaObject_00d0dba0;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)&local_38,button_image);
  QIcon::QIcon((QIcon *)&stack0xffffffffffffffc0,(QPixmap *)&local_38);
  QAction::setIcon((QIcon *)in_RDI);
  QIcon::~QIcon((QIcon *)&stack0xffffffffffffffc0);
  QAction::setCheckable(SUB81(in_RDI,0));
  combined = 0;
  QObject::connect<void(QAction::*)(bool),void(QWhatsThisAction::*)()>
            ((Object *)QAction::triggered,in_stack_ffffffffffffffa0,
             (ContextType *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (offset_in_QWhatsThisAction_to_subr *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffffc0
            );
  QMetaObject::Connection::~Connection(&local_48);
  QVar1 = Qt::operator|(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
  QVar2 = QKeyCombination::fromCombined(combined);
  QVar3 = QKeyCombination::fromCombined(combined);
  QVar4 = QKeyCombination::fromCombined(combined);
  QKeySequence::QKeySequence((QKeySequence *)&stack0xffffffffffffffa0,QVar1,QVar2,QVar3,QVar4);
  QAction::setShortcut((QKeySequence *)in_RDI);
  QKeySequence::~QKeySequence((QKeySequence *)&stack0xffffffffffffffa0);
  QPixmap::~QPixmap((QPixmap *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWhatsThisAction::QWhatsThisAction(QObject *parent) : QAction(tr("What's This?"), parent)
{
#ifndef QT_NO_IMAGEFORMAT_XPM
    QPixmap p(button_image);
    setIcon(p);
#endif
    setCheckable(true);
    connect(this, &QWhatsThisAction::triggered, this, &QWhatsThisAction::actionTriggered);
#ifndef QT_NO_SHORTCUT
    setShortcut(Qt::ShiftModifier | Qt::Key_F1);
#endif
}